

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

void sysbvm_context_saveImageToFileNamed(sysbvm_context_t *context,char *filename)

{
  return;
}

Assistant:

SYSBVM_API void sysbvm_context_saveImageToFileNamed(sysbvm_context_t *context, const char *filename)
{
#if 0    
    sysbvm_gc_collect(context);
#ifdef _WIN32
    FILE *outputFile = NULL;
    if(fopen_s(&outputFile, filename, "wb"))
        return;
#else
    FILE *outputFile = fopen(filename, "wb");
#endif
    fwrite("TVIM", 4, 1, outputFile);
    fwrite(&context->targetWordSize, sizeof(context->targetWordSize), 1, outputFile);
    fwrite(&context->identityHashSeed, sizeof(context->identityHashSeed), 1, outputFile);
    fwrite(&context->roots, sizeof(context->roots), 1, outputFile);
    sysbvm_heap_dumpToFile(&context->heap, outputFile);
    fclose(outputFile);
#else
    (void)context;
    (void)filename;
#endif
}